

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QGate1.cpp
# Opt level: O1

void __thiscall
qclab::qgates::QGate1<std::complex<double>_>::apply
          (QGate1<std::complex<double>_> *this,Side side,Op op,int nbQubits,
          SquareMatrix<std::complex<double>_> *matrix,int offset)

{
  undefined8 *puVar1;
  complex<double> *pcVar2;
  complex<double> *pcVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  long lVar12;
  SquareMatrix<std::complex<double>_> mat1;
  complex<double> x2;
  complex<double> x1;
  SquareMatrix<std::complex<double>_> local_e8;
  uint local_cc;
  SquareMatrix<std::complex<double>_> local_c8;
  __uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_> local_b8;
  double local_b0;
  long local_a8;
  long local_a0;
  ulong local_98;
  long local_90;
  long local_88;
  ulong local_80;
  ulong local_78;
  long local_70;
  SquareMatrix<std::complex<double>_> local_68;
  complex<double> local_58;
  complex<double> local_48;
  
  if (nbQubits < 1) {
    __assert_fail("nbQubits >= 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/src/qgates/QGate1.cpp"
                  ,0x1f,
                  "virtual void qclab::qgates::QGate1<std::complex<double>>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = std::complex<double>]"
                 );
  }
  if (matrix->size_ != (long)(1 << ((byte)nbQubits & 0x1f))) {
    __assert_fail("matrix.size() == 1 << nbQubits",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/src/qgates/QGate1.cpp"
                  ,0x20,
                  "virtual void qclab::qgates::QGate1<std::complex<double>>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = std::complex<double>]"
                 );
  }
  iVar4 = (*(this->super_QObject<std::complex<double>_>)._vptr_QObject[3])();
  local_cc = iVar4 + offset;
  if (nbQubits <= (int)local_cc) {
    __assert_fail("qubit < nbQubits",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/src/qgates/QGate1.cpp"
                  ,0x22,
                  "virtual void qclab::qgates::QGate1<std::complex<double>>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = std::complex<double>]"
                 );
  }
  (*(this->super_QObject<std::complex<double>_>)._vptr_QObject[7])(&local_c8,this);
  dense::operateInPlace<qclab::dense::SquareMatrix<std::complex<double>>>(op,&local_c8);
  if (side == Left) {
    if (nbQubits == 1) {
      dense::SquareMatrix<std::complex<double>_>::operator*=(matrix,&local_c8);
    }
    else {
      local_88 = CONCAT44(local_88._4_4_,~local_cc + nbQubits);
      if (0 < matrix->size_) {
        local_70 = (long)(1 << ((byte)(~local_cc + nbQubits) & 0x1f));
        uVar10 = 1 << ((byte)local_cc & 0x1f);
        local_90 = 1;
        if (1 < local_70) {
          local_90 = local_70;
        }
        local_a0 = local_70 * 2;
        if ((int)uVar10 < 2) {
          uVar10 = 1;
        }
        local_98 = (ulong)uVar10;
        local_a8 = 0;
        do {
          lVar8 = local_a8;
          if (local_cc != 0x1f) {
            uVar9 = 0;
            uVar6 = 0;
            do {
              lVar11 = local_90;
              local_80 = uVar6;
              local_78 = uVar9;
              if ((int)local_88 != 0x1f) {
                do {
                  lVar12 = local_70 + uVar9;
                  pcVar2 = (matrix->data_)._M_t.
                           super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                           .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
                  pcVar3 = pcVar2 + matrix->size_ * uVar9 + lVar8;
                  local_48._M_value._0_8_ = *(undefined8 *)pcVar3->_M_value;
                  local_48._M_value._8_8_ = *(undefined8 *)(pcVar3->_M_value + 8);
                  pcVar2 = pcVar2 + matrix->size_ * lVar12 + lVar8;
                  local_58._M_value._0_8_ = *(undefined8 *)pcVar2->_M_value;
                  local_58._M_value._8_8_ = *(undefined8 *)(pcVar2->_M_value + 8);
                  local_e8.size_ =
                       *(size_type_conflict *)
                        local_c8.data_._M_t.
                        super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                        .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
                  local_e8.data_._M_t.
                  super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                  .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                       *(__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
                         *)&((__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                              *)((long)local_c8.data_._M_t.
                                       super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                       .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                       _M_head_impl + 8))->_M_t;
                  std::complex<double>::operator*=((complex<double> *)&local_e8,&local_48);
                  local_b0 = (double)local_e8.size_;
                  local_b8._M_t.
                  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                  .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                       (tuple<std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>)
                       (tuple<std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>)
                       local_e8.data_._M_t.
                       super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                       .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
                  local_e8.size_ =
                       *(size_type_conflict *)
                        ((complex<double> *)
                        ((long)local_c8.data_._M_t.
                               super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                               .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl +
                        0x10))->_M_value;
                  local_e8.data_._M_t.
                  super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                  .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                       *(__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
                         *)&((__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                              *)((long)((complex<double> *)
                                       ((long)local_c8.data_._M_t.
                                              super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                              .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                              _M_head_impl + 0x10))->_M_value + 8))->_M_t;
                  std::complex<double>::operator*=((complex<double> *)&local_e8,&local_58);
                  lVar5 = matrix->size_ * uVar9;
                  pcVar3 = (matrix->data_)._M_t.
                           super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                           .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
                  *(double *)pcVar3[lVar5 + lVar8]._M_value = local_b0 + (double)local_e8.size_;
                  *(double *)(pcVar3[lVar5 + lVar8]._M_value + 8) =
                       (double)local_b8._M_t.
                               super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                               .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl +
                       (double)local_e8.data_._M_t.
                               super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                               .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
                  pcVar3 = (complex<double> *)
                           ((long)local_c8.data_._M_t.
                                  super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                  .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl
                           + local_c8.size_ * 0x10);
                  local_e8.size_ = *(size_type_conflict *)pcVar3->_M_value;
                  local_e8.data_._M_t.
                  super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                  .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                       *(__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
                         *)&((__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                              *)((long)pcVar3->_M_value + 8))->_M_t;
                  std::complex<double>::operator*=((complex<double> *)&local_e8,&local_48);
                  local_b0 = (double)local_e8.size_;
                  local_b8._M_t.
                  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                  .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                       (tuple<std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>)
                       (tuple<std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>)
                       local_e8.data_._M_t.
                       super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                       .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
                  local_e8.size_ =
                       *(size_type_conflict *)
                        ((complex<double> *)
                        ((long)local_c8.data_._M_t.
                               super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                               .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl +
                        0x10))[local_c8.size_]._M_value;
                  local_e8.data_._M_t.
                  super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                  .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                       (__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
                        )((_Head_base<0UL,_std::complex<double>_*,_false> *)
                         ((long)((complex<double> *)
                                ((long)local_c8.data_._M_t.
                                       super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                       .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                       _M_head_impl + 0x10))[local_c8.size_]._M_value + 8))->
                         _M_head_impl;
                  std::complex<double>::operator*=((complex<double> *)&local_e8,&local_58);
                  lVar12 = lVar12 * matrix->size_;
                  pcVar3 = (matrix->data_)._M_t.
                           super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                           .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
                  *(double *)pcVar3[lVar12 + lVar8]._M_value = local_b0 + (double)local_e8.size_;
                  *(double *)(pcVar3[lVar12 + lVar8]._M_value + 8) =
                       (double)local_b8._M_t.
                               super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                               .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl +
                       (double)local_e8.data_._M_t.
                               super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                               .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
                  uVar9 = uVar9 + 1;
                  lVar11 = lVar11 + -1;
                } while (lVar11 != 0);
              }
              uVar6 = local_80 + 1;
              uVar9 = local_78 + local_a0;
            } while (uVar6 != local_98);
          }
          local_a8 = local_a8 + 1;
        } while (local_a8 < matrix->size_);
      }
    }
  }
  else if (nbQubits == 1) {
    dense::SquareMatrix<std::complex<double>_>::SquareMatrix(&local_68,&local_c8);
    dense::SquareMatrix<std::complex<double>_>::operator*=(&local_68,matrix);
    dense::SquareMatrix<std::complex<double>_>::SquareMatrix(&local_e8,&local_68);
    dense::SquareMatrix<std::complex<double>_>::operator=(matrix,&local_e8);
    if ((_Head_base<0UL,_std::complex<double>_*,_false>)
        local_e8.data_._M_t.
        super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
        _M_t.
        super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
        .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl !=
        (_Head_base<0UL,_std::complex<double>_*,_false>)0x0) {
      operator_delete__((void *)local_e8.data_._M_t.
                                super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl);
    }
    local_e8.data_._M_t.
    super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t.
    super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
    super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
         (__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
          )(__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>)0x0;
    if (local_68.data_._M_t.
        super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
        _M_t.
        super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
        .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>)0x0) {
      operator_delete__((void *)local_68.data_._M_t.
                                super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl);
    }
    local_68.data_._M_t.
    super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t.
    super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
    super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
         (__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
          )(__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>)0x0;
  }
  else {
    local_80 = CONCAT44(local_80._4_4_,~local_cc + nbQubits);
    if (0 < matrix->size_) {
      lVar8 = (long)(1 << ((byte)(~local_cc + nbQubits) & 0x1f));
      uVar10 = 1 << ((byte)local_cc & 0x1f);
      local_88 = 1;
      if (1 < lVar8) {
        local_88 = lVar8;
      }
      if ((int)uVar10 < 2) {
        uVar10 = 1;
      }
      local_98 = (ulong)uVar10;
      local_90 = lVar8 << 5;
      lVar12 = 0;
      lVar11 = 0;
      do {
        local_a0 = lVar11;
        if (local_cc != 0x1f) {
          lVar11 = 0;
          uVar6 = 0;
          do {
            lVar5 = local_88;
            local_78 = uVar6;
            local_70 = lVar11;
            if ((int)local_80 != 0x1f) {
              do {
                lVar7 = matrix->size_ * lVar12;
                pcVar3 = (matrix->data_)._M_t.
                         super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                         .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
                puVar1 = (undefined8 *)(pcVar3->_M_value + lVar11 + lVar7);
                local_48._M_value._0_8_ = *puVar1;
                local_48._M_value._8_8_ = puVar1[1];
                puVar1 = (undefined8 *)(pcVar3[lVar8]._M_value + lVar11 + lVar7);
                local_58._M_value._0_8_ = *puVar1;
                local_58._M_value._8_8_ = puVar1[1];
                local_e8.size_ =
                     *(size_type_conflict *)
                      local_c8.data_._M_t.
                      super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                      .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
                local_e8.data_._M_t.
                super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                     *(__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
                       *)&((__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                            *)((long)local_c8.data_._M_t.
                                     super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                     .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                     _M_head_impl + 8))->_M_t;
                std::complex<double>::operator*=((complex<double> *)&local_e8,&local_48);
                local_b0 = (double)local_e8.size_;
                local_b8._M_t.
                super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                     (tuple<std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>)
                     (tuple<std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>)
                     local_e8.data_._M_t.
                     super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                     .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
                local_e8.size_ =
                     *(size_type_conflict *)
                      ((complex<double> *)
                      ((long)local_c8.data_._M_t.
                             super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                             .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl +
                      local_c8.size_ * 0x10))->_M_value;
                local_e8.data_._M_t.
                super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                     *(__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
                       *)&((__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                            *)((long)((complex<double> *)
                                     ((long)local_c8.data_._M_t.
                                            super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                            .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                            _M_head_impl + local_c8.size_ * 0x10))->_M_value + 8))->
                          _M_t;
                std::complex<double>::operator*=((complex<double> *)&local_e8,&local_58);
                lVar7 = matrix->size_ * lVar12;
                pcVar3 = (matrix->data_)._M_t.
                         super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                         .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
                *(double *)(pcVar3->_M_value + lVar11 + lVar7) = local_b0 + (double)local_e8.size_;
                *(double *)(pcVar3->_M_value + lVar11 + 8 + lVar7) =
                     (double)local_b8._M_t.
                             super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                             .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl +
                     (double)local_e8.data_._M_t.
                             super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                             .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
                local_e8.size_ =
                     *(size_type_conflict *)
                      ((complex<double> *)
                      ((long)local_c8.data_._M_t.
                             super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                             .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl +
                      0x10))->_M_value;
                local_e8.data_._M_t.
                super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                     *(__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
                       *)&((__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                            *)((long)local_c8.data_._M_t.
                                     super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                     .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                     _M_head_impl + 0x18))->_M_t;
                std::complex<double>::operator*=((complex<double> *)&local_e8,&local_48);
                local_b0 = (double)local_e8.size_;
                local_b8._M_t.
                super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                     (tuple<std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>)
                     (tuple<std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>)
                     local_e8.data_._M_t.
                     super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                     .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
                local_e8.size_ =
                     *(size_type_conflict *)
                      ((complex<double> *)
                      ((long)local_c8.data_._M_t.
                             super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                             .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl +
                      0x10))[local_c8.size_]._M_value;
                local_e8.data_._M_t.
                super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                     (__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
                      )((_Head_base<0UL,_std::complex<double>_*,_false> *)
                       ((long)((complex<double> *)
                              ((long)local_c8.data_._M_t.
                                     super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                     .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                     _M_head_impl + 0x10))[local_c8.size_]._M_value + 8))->
                       _M_head_impl;
                std::complex<double>::operator*=((complex<double> *)&local_e8,&local_58);
                lVar7 = matrix->size_ * lVar12;
                pcVar3 = (matrix->data_)._M_t.
                         super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                         .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
                *(double *)(pcVar3[lVar8]._M_value + lVar11 + lVar7) =
                     local_b0 + (double)local_e8.size_;
                *(double *)(pcVar3[lVar8]._M_value + lVar11 + 8 + lVar7) =
                     (double)local_b8._M_t.
                             super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                             .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl +
                     (double)local_e8.data_._M_t.
                             super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                             .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
                lVar11 = lVar11 + 0x10;
                lVar5 = lVar5 + -1;
              } while (lVar5 != 0);
            }
            uVar6 = local_78 + 1;
            lVar11 = local_70 + local_90;
          } while (uVar6 != local_98);
        }
        lVar11 = local_a0 + 1;
        lVar12 = lVar12 + 0x10;
      } while (lVar11 < matrix->size_);
    }
  }
  if (local_c8.data_._M_t.
      super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t
      .super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
      super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>)0x0) {
    operator_delete__((void *)local_c8.data_._M_t.
                              super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                              .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl);
  }
  return;
}

Assistant:

void QGate1< T >::apply( Side side , Op op , const int nbQubits ,
                           qclab::dense::SquareMatrix< T >& matrix ,
                           const int offset ) const {
    assert( nbQubits >= 1 ) ;
    assert( matrix.size() == 1 << nbQubits ) ;
    const int qubit = this->qubit() + offset ;
    assert( qubit < nbQubits ) ;
    // operation
    qclab::dense::SquareMatrix< T >  mat1 = this->matrix() ;
    qclab::dense::operateInPlace( op , mat1 ) ;
    // side
    if ( side == Side::Left ) {
      if ( nbQubits == 1 ) {
        matrix *= mat1 ;
      } else {
        // matrix *= kron( Ileft , mat1 , Iright )
        const int64_t nLeft  = 1 << qubit ;
        const int64_t nRight = 1 << ( nbQubits - qubit - 1 ) ;
        #pragma omp parallel for
        for ( int64_t i = 0; i < matrix.rows(); i++ ) {
          for ( int64_t k = 0; k < nLeft; k++ ) {
            for ( int64_t j = 0; j < nRight; j++ ) {
              const int64_t j1 = j + 2 * k * nRight ;
              const int64_t j2 = j1 + nRight ;
              const T x1 = matrix(i,j1) ;
              const T x2 = matrix(i,j2) ;
              matrix(i,j1) = mat1(0,0) * x1 + mat1(1,0) * x2 ;
              matrix(i,j2) = mat1(0,1) * x1 + mat1(1,1) * x2 ;
            }
          }
        }
      }
    } else {
      if ( nbQubits == 1 ) {
        matrix = mat1 * matrix ;
      } else {
        // matrix = kron( Ileft , mat1 , Iright ) * matrix
        const int64_t nLeft  = 1 << qubit ;
        const int64_t nRight = 1 << ( nbQubits - qubit - 1 ) ;
        #pragma omp parallel for
        for ( int64_t j = 0; j < matrix.cols(); j++ ) {
          for ( int64_t k = 0; k < nLeft; k++ ) {
            for ( int64_t i = 0; i < nRight; i++ ) {
              const int64_t i1 = i + 2 * k * nRight ;
              const int64_t i2 = i1 + nRight ;
              const T x1 = matrix(i1,j) ;
              const T x2 = matrix(i2,j) ;
              matrix(i1,j) = mat1(0,0) * x1 + mat1(0,1) * x2 ;
              matrix(i2,j) = mat1(1,0) * x1 + mat1(1,1) * x2 ;
            }
          }
        }
      }
    }
  }